

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_trie_match(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  nn_trie_node **ppnVar5;
  size_t in_RDX;
  uint8_t *in_RSI;
  undefined8 *in_RDI;
  nn_trie_node **tmp;
  nn_trie_node *node;
  nn_trie_node *in_stack_ffffffffffffffc8;
  nn_trie_node *local_28;
  size_t local_20;
  uint8_t *local_18;
  
  local_28 = (nn_trie_node *)*in_RDI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if (local_28 == (nn_trie_node *)0x0) {
      return 0;
    }
    uVar3 = nn_node_check_prefix(local_28,local_18,local_20);
    if (uVar3 != local_28->prefix_len) break;
    bVar1 = local_28->prefix_len;
    bVar2 = local_28->prefix_len;
    iVar4 = nn_node_has_subscribers(local_28);
    if (iVar4 != 0) {
      return 1;
    }
    ppnVar5 = nn_node_next(in_stack_ffffffffffffffc8,'\0');
    if (ppnVar5 == (nn_trie_node **)0x0) {
      in_stack_ffffffffffffffc8 = (nn_trie_node *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 = *ppnVar5;
    }
    local_18 = local_18 + (long)(int)(uint)bVar1 + 1;
    local_20 = (local_20 - bVar2) - 1;
    local_28 = in_stack_ffffffffffffffc8;
  }
  return 0;
}

Assistant:

int nn_trie_match (struct nn_trie *self, const uint8_t *data, size_t size)
{
    struct nn_trie_node *node;
    struct nn_trie_node **tmp;

    node = self->root;
    while (1) {

        /*  If we are at the end of the trie, return. */
        if (!node)
            return 0;

        /*  Check whether whole prefix matches the data. If not so,
            the whole string won't match. */
        if (nn_node_check_prefix (node, data, size) != node->prefix_len)
            return 0;

        /*  Skip the prefix. */
        data += node->prefix_len;
        size -= node->prefix_len;

        /*  If all the data are matched, return. */
        if (nn_node_has_subscribers (node))
            return 1;

        /*  Move to the next node. */
        tmp = nn_node_next (node, *data);
        node = tmp ? *tmp : NULL;
        ++data;
        --size;
    }
}